

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Generation.cpp
# Opt level: O1

void __thiscall Generation::commit(Generation *this)

{
  pointer pcVar1;
  bool bVar2;
  unsigned_long value;
  File genFile;
  MutexLocker lock;
  unsigned_long local_80;
  File local_78;
  MutexLocker local_40;
  string local_30;
  
  if (this->isToken == true) {
    MutexLocker::MutexLocker(&local_40,this->genMutex);
    pcVar1 = (this->path)._M_dataplus._M_p;
    local_30._M_dataplus._M_p = (pointer)&local_30.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_30,pcVar1,pcVar1 + (this->path)._M_string_length);
    File::File(&local_78,&local_30,this->umask,true,true,true,false);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_30._M_dataplus._M_p != &local_30.field_2) {
      operator_delete(local_30._M_dataplus._M_p);
    }
    bVar2 = File::isValid(&local_78);
    if (bVar2) {
      File::lock(&local_78,true);
      bVar2 = File::isEmpty(&local_78);
      if (bVar2) {
        value = this->currentValue + 1 + (ulong)(this->currentValue == 0xffffffffffffffff);
        this->currentValue = value;
        this->pendingUpdate = false;
        File::writeULong(&local_78,value);
        File::unlock(&local_78);
      }
      else {
        local_80 = 0;
        bVar2 = File::readULong(&local_78,&local_80);
        if (bVar2) {
          bVar2 = File::seek(&local_78,0);
        }
        else {
          bVar2 = false;
        }
        if (this->pendingUpdate == true) {
          local_80 = local_80 + 1 + (ulong)(local_80 == 0xffffffffffffffff);
        }
        if (bVar2 != false) {
          bVar2 = File::writeULong(&local_78,local_80);
          if (bVar2) {
            this->currentValue = local_80;
            this->pendingUpdate = false;
          }
        }
        File::unlock(&local_78);
      }
    }
    File::~File(&local_78);
    MutexLocker::~MutexLocker(&local_40);
  }
  return;
}

Assistant:

void Generation::commit()
{
	if (isToken)
	{
		MutexLocker lock(genMutex);

		File genFile(path, umask, true, true, true, false);

		if (!genFile.isValid())
		{
			return;
		}

		genFile.lock();

		if (genFile.isEmpty())
		{
			currentValue++;

			if (currentValue == 0)
			{
				currentValue++;
			}

			pendingUpdate = false;

			(void) genFile.writeULong(currentValue);

			genFile.unlock();

			return;
		}

		unsigned long onDisk = 0;

		bool bOK = true;

		bOK = bOK && genFile.readULong(onDisk);
		bOK = bOK && genFile.seek(0L);

		if (pendingUpdate)
		{
			onDisk++;

			if (onDisk == 0)
			{
				onDisk++;
			}
		}

		bOK = bOK && genFile.writeULong(onDisk);

		if (bOK)
		{
			currentValue = onDisk;

			pendingUpdate = false;
		}

		genFile.unlock();
	}
}